

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typed_expression.cc
# Opt level: O0

ostream * tchecker::operator<<(ostream *os,expression_type_t type)

{
  runtime_error *this;
  expression_type_t type_local;
  ostream *os_local;
  
  switch(type) {
  case EXPR_TYPE_BAD:
    os_local = std::operator<<(os,"BAD");
    break;
  case EXPR_TYPE_INTTERM:
    os_local = std::operator<<(os,"INTTERM");
    break;
  case EXPR_TYPE_INTVAR:
    os_local = std::operator<<(os,"INTVAR");
    break;
  case EXPR_TYPE_INTARRAY:
    os_local = std::operator<<(os,"INTARRAY");
    break;
  case EXPR_TYPE_LOCALINTVAR:
    os_local = std::operator<<(os,"LOCALINTVAR");
    break;
  case EXPR_TYPE_LOCALINTARRAY:
    os_local = std::operator<<(os,"LOCALINTARRAY");
    break;
  case EXPR_TYPE_INTLVALUE:
    os_local = std::operator<<(os,"INTLVALUE");
    break;
  default:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"incomplete switch statement");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case EXPR_TYPE_CLKVAR:
    os_local = std::operator<<(os,"CLKVAR");
    break;
  case EXPR_TYPE_CLKARRAY:
    os_local = std::operator<<(os,"CLKARRAY");
    break;
  case EXPR_TYPE_CLKLVALUE:
    os_local = std::operator<<(os,"CLKLVALUE");
    break;
  case EXPR_TYPE_CLKDIFF:
    os_local = std::operator<<(os,"CLKDIFF");
    break;
  case EXPR_TYPE_INTCLKSUM:
    os_local = std::operator<<(os,"INTCLKSUM");
    break;
  case EXPR_TYPE_ATOMIC_PREDICATE:
    os_local = std::operator<<(os,"ATOMIC_PREDICATE");
    break;
  case EXPR_TYPE_CLKCONSTR_SIMPLE:
    os_local = std::operator<<(os,"CLKCONSTR_SIMPLE");
    break;
  case EXPR_TYPE_CLKCONSTR_DIAGONAL:
    os_local = std::operator<<(os,"CLKCONSTR_DIAGONAL");
    break;
  case EXPR_TYPE_CONJUNCTIVE_FORMULA:
    os_local = std::operator<<(os,"CONJUNCTIVE_FORMULA");
  }
  return os_local;
}

Assistant:

std::ostream & operator<<(std::ostream & os, enum tchecker::expression_type_t type)
{
  switch (type) {
  case EXPR_TYPE_BAD:
    return os << "BAD";
  case EXPR_TYPE_INTTERM:
    return os << "INTTERM";
  case EXPR_TYPE_INTVAR:
    return os << "INTVAR";
  case EXPR_TYPE_INTARRAY:
    return os << "INTARRAY";
  case EXPR_TYPE_LOCALINTVAR:
    return os << "LOCALINTVAR";
  case EXPR_TYPE_LOCALINTARRAY:
    return os << "LOCALINTARRAY";
  case EXPR_TYPE_INTLVALUE:
    return os << "INTLVALUE";
  case EXPR_TYPE_CLKVAR:
    return os << "CLKVAR";
  case EXPR_TYPE_CLKARRAY:
    return os << "CLKARRAY";
  case EXPR_TYPE_CLKLVALUE:
    return os << "CLKLVALUE";
  case EXPR_TYPE_CLKDIFF:
    return os << "CLKDIFF";
  case EXPR_TYPE_INTCLKSUM:
    return os << "INTCLKSUM";
  case EXPR_TYPE_ATOMIC_PREDICATE:
    return os << "ATOMIC_PREDICATE";
  case EXPR_TYPE_CLKCONSTR_SIMPLE:
    return os << "CLKCONSTR_SIMPLE";
  case EXPR_TYPE_CLKCONSTR_DIAGONAL:
    return os << "CLKCONSTR_DIAGONAL";
  case EXPR_TYPE_CONJUNCTIVE_FORMULA:
    return os << "CONJUNCTIVE_FORMULA";
  default:
    throw std::runtime_error("incomplete switch statement");
  }
}